

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConstructMapExpression
          (duckdb *this,ClientContext *context,idx_t param_2,ColumnMapResult *mapping,
          MultiFileColumnDefinition *global_column,bool is_trivially_mappable)

{
  LogicalType *rhs;
  MultiFileColumnDefinition *pMVar1;
  BaseExpression *pBVar2;
  undefined1 auVar3 [8];
  _func_int **pp_Var4;
  bool bVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var7;
  tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_> this_00;
  reference pvVar8;
  reference target_type;
  undefined8 uVar9;
  pointer *__ptr;
  LogicalType *other;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> expr;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_data;
  ScalarFunction remap_fun;
  undefined1 local_218 [8];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_210;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_208;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_1e8;
  undefined1 local_1c8 [88];
  LogicalType local_170;
  ScalarFunction local_158;
  
  local_1f8._M_allocated_capacity = (size_type)context;
  local_1f8._8_8_ = this;
  optional_ptr<const_duckdb::MultiFileColumnDefinition,_true>::CheckValid(&mapping->local_column);
  pMVar1 = (mapping->local_column).ptr;
  local_210._M_head_impl = (Expression *)0x0;
  _Var6._M_head_impl = (Expression *)operator_new(0x60);
  other = &pMVar1->type;
  LogicalType::LogicalType((LogicalType *)&local_158,other);
  BoundReferenceExpression::BoundReferenceExpression
            ((BoundReferenceExpression *)_Var6._M_head_impl,(LogicalType *)&local_158,param_2);
  LogicalType::~LogicalType((LogicalType *)&local_158);
  if (local_210._M_head_impl != (Expression *)0x0) {
    pBVar2 = &(local_210._M_head_impl)->super_BaseExpression;
    local_210._M_head_impl = _Var6._M_head_impl;
    (*pBVar2->_vptr_BaseExpression[1])();
    _Var6._M_head_impl = local_210._M_head_impl;
  }
  local_210._M_head_impl = _Var6._M_head_impl;
  rhs = &global_column->type;
  if ((global_column->type).id_ == STRUCT) {
    bVar5 = (mapping->column_map).is_null;
    if (bVar5 == false) {
      if ((mapping->column_map).type_.id_ != STRUCT || is_trivially_mappable) goto LAB_015b9639;
    }
    else if (is_trivially_mappable) goto LAB_015b9639;
    if (bVar5 == false) {
      local_1e8.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1e8.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_1e8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_210);
      LogicalType::LogicalType(&local_170,rhs);
      Value::Value((Value *)local_1c8,&local_170);
      _Var7.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)operator_new(0x98);
      Value::Value((Value *)&local_158,(Value *)local_1c8);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)
                 _Var7.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,
                 (Value *)&local_158);
      Value::~Value((Value *)&local_158);
      local_218 = (undefined1  [8])
                  _Var7.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_1e8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_218);
      if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_218 !=
          (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
        (*(((Expression *)local_218)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_218 = (undefined1  [8])0x0;
      Value::~Value((Value *)local_1c8);
      LogicalType::~LogicalType(&local_170);
      this_00.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
           )operator_new(0x98);
      Value::Value((Value *)&local_158,&mapping->column_map);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)
                 this_00.
                 super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                 .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl,
                 (Value *)&local_158);
      Value::~Value((Value *)&local_158);
      local_1c8._0_8_ =
           this_00.
           super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
           .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_1e8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_1c8);
      if ((_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
          local_1c8._0_8_ != (BaseStatistics *)0x0) {
        (**(code **)(*(long *)local_1c8._0_8_ + 8))();
      }
      if ((mapping->default_value).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0) {
        LogicalType::LogicalType((LogicalType *)(local_1c8 + 0x40),SQLNULL);
        Value::Value((Value *)local_1c8,(LogicalType *)(local_1c8 + 0x40));
        _Var7.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)operator_new(0x98);
        Value::Value((Value *)&local_158,(Value *)local_1c8);
        BoundConstantExpression::BoundConstantExpression
                  ((BoundConstantExpression *)
                   _Var7.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,
                   (Value *)&local_158);
        Value::~Value((Value *)&local_158);
        local_218 = (undefined1  [8])
                    _Var7.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_1e8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_218);
        if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_218 !=
            (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
          (*(((Expression *)local_218)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_218 = (undefined1  [8])0x0;
        Value::~Value((Value *)local_1c8);
        LogicalType::~LogicalType((LogicalType *)(local_1c8 + 0x40));
      }
      else {
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_1e8,&mapping->default_value);
      }
      RemapStructFun::GetFunction();
      (*local_158.bind)((ClientContext *)local_1c8,(ScalarFunction *)local_1f8._M_allocated_capacity
                        ,(vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)&local_158);
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](&local_1e8,0);
      local_208._M_head_impl =
           (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      target_type = vector<duckdb::LogicalType,_true>::operator[]
                              (&local_158.super_BaseScalarFunction.super_SimpleFunction.arguments,0)
      ;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_218,(ClientContext *)local_1f8._M_allocated_capacity,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_208,target_type,false);
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](&local_1e8,0);
      auVar3 = local_218;
      local_218 = (undefined1  [8])0x0;
      _Var6._M_head_impl =
           (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar3;
      if (_Var6._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
      }
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_218 != (Expression *)0x0) {
        (**(code **)(*(long *)local_218 + 8))();
      }
      local_218 = (undefined1  [8])0x0;
      if (local_208._M_head_impl != (Expression *)0x0) {
        (*((local_208._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_208._M_head_impl = (Expression *)0x0;
      make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType_const&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>>
                ((duckdb *)local_218,rhs,&local_158,&local_1e8,
                 (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)local_1c8);
      uVar9 = local_1f8._8_8_;
      auVar3 = local_218;
      local_218 = (undefined1  [8])0x0;
      *(undefined1 (*) [8])local_1f8._8_8_ = auVar3;
      if ((BoundConstantExpression *)local_1c8._0_8_ != (BoundConstantExpression *)0x0) {
        (*(((Expression *)local_1c8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__ScalarFunction_0247c280;
      if (local_158.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_158.function.super__Function_base._M_manager)
                  ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,
                   __destroy_functor);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_1e8);
    }
    else {
      *(Expression **)local_1f8._8_8_ =
           (mapping->default_value).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (mapping->default_value).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      uVar9 = local_1f8._8_8_;
    }
  }
  else {
LAB_015b9639:
    bVar5 = LogicalType::operator==(other,rhs);
    if (!bVar5) {
      local_200._M_head_impl = local_210._M_head_impl;
      local_210._M_head_impl = (Expression *)0x0;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)&local_158,(ClientContext *)local_1f8._M_allocated_capacity,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_200,rhs,false);
      pp_Var4 = local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                _vptr_Function;
      _Var6._M_head_impl = local_210._M_head_impl;
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)0x0;
      local_210._M_head_impl = (Expression *)pp_Var4;
      if (_Var6._M_head_impl != (Expression *)0x0) {
        (*((_Var6._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      if (local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
          (_func_int **)0x0) {
        (**(code **)(*local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      _vptr_Function + 8))();
      }
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)0x0;
      if ((BoundReferenceExpression *)local_200._M_head_impl != (BoundReferenceExpression *)0x0) {
        (*(((Expression *)&(local_200._M_head_impl)->super_BaseExpression)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
      local_200._M_head_impl = (Expression *)0x0;
    }
    *(Expression **)local_1f8._8_8_ = local_210._M_head_impl;
    local_210._M_head_impl = (Expression *)0x0;
    uVar9 = local_1f8._8_8_;
  }
  if ((BoundReferenceExpression *)local_210._M_head_impl != (BoundReferenceExpression *)0x0) {
    (*(((Expression *)&(local_210._M_head_impl)->super_BaseExpression)->super_BaseExpression).
      _vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)uVar9;
}

Assistant:

unique_ptr<Expression> ConstructMapExpression(ClientContext &context, idx_t local_idx, ColumnMapResult &mapping,
                                              const MultiFileColumnDefinition &global_column,
                                              bool is_trivially_mappable) {
	auto &local_column = *mapping.local_column;
	unique_ptr<Expression> expr;
	expr = make_uniq<BoundReferenceExpression>(local_column.type, local_idx);
	if (global_column.type.id() != LogicalTypeId::STRUCT ||
	    (!mapping.column_map.IsNull() && mapping.column_map.type().id() != LogicalTypeId::STRUCT) ||
	    is_trivially_mappable) {
		// not a struct - potentially add a cast
		if (local_column.type != global_column.type) {
			expr = BoundCastExpression::AddCastToType(context, std::move(expr), global_column.type);
		}
		return expr;
	}
	// struct column - generate a remap_struct - but only if we have any columns to remap
	if (mapping.column_map.IsNull()) {
		// no columns to map - emit the default value directly
		return std::move(mapping.default_value);
	}
	// generate the remap_struct function call
	vector<unique_ptr<Expression>> children;
	children.push_back(std::move(expr));
	children.push_back(make_uniq<BoundConstantExpression>(Value(global_column.type)));
	children.push_back(make_uniq<BoundConstantExpression>(std::move(mapping.column_map)));
	if (!mapping.default_value) {
		children.push_back(make_uniq<BoundConstantExpression>(Value()));
	} else {
		children.push_back(std::move(mapping.default_value));
	}
	auto remap_fun = RemapStructFun::GetFunction();
	auto bind_data = remap_fun.bind(context, remap_fun, children);
	children[0] = BoundCastExpression::AddCastToType(context, std::move(children[0]), remap_fun.arguments[0]);
	return make_uniq<BoundFunctionExpression>(global_column.type, std::move(remap_fun), std::move(children),
	                                          std::move(bind_data));
}